

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.c
# Opt level: O3

int quicly_sendbuf_write_vec(quicly_stream_t *stream,quicly_sendbuf_t *sb,quicly_sendbuf_vec_t *vec)

{
  ulong uVar1;
  int iVar2;
  quicly_sendbuf_vec_t *__ptr;
  ulong uVar3;
  size_t sVar4;
  
  uVar3 = (sb->vecs).size;
  uVar1 = (sb->vecs).capacity;
  if (uVar1 < uVar3) {
    __assert_fail("sb->vecs.size <= sb->vecs.capacity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/streambuf.c"
                  ,0x9c,
                  "int quicly_sendbuf_write_vec(quicly_stream_t *, quicly_sendbuf_t *, quicly_sendbuf_vec_t *)"
                 );
  }
  __ptr = (sb->vecs).entries;
  if (uVar3 == uVar1) {
    sVar4 = 4;
    if (uVar3 != 0) {
      sVar4 = uVar3 * 2;
    }
    __ptr = (quicly_sendbuf_vec_t *)realloc(__ptr,sVar4 * 0x18);
    if (__ptr == (quicly_sendbuf_vec_t *)0x0) {
      return 0x201;
    }
    (sb->vecs).entries = __ptr;
    (sb->vecs).capacity = sVar4;
    uVar3 = (sb->vecs).size;
  }
  (sb->vecs).size = uVar3 + 1;
  __ptr[uVar3].cbdata = vec->cbdata;
  sVar4 = vec->len;
  __ptr[uVar3].cb = vec->cb;
  __ptr[uVar3].len = sVar4;
  sb->bytes_written = sb->bytes_written + vec->len;
  iVar2 = quicly_stream_sync_sendbuf(stream,1);
  return iVar2;
}

Assistant:

int quicly_sendbuf_write_vec(quicly_stream_t *stream, quicly_sendbuf_t *sb, quicly_sendbuf_vec_t *vec)
{
    assert(sb->vecs.size <= sb->vecs.capacity);

    if (sb->vecs.size == sb->vecs.capacity) {
        quicly_sendbuf_vec_t *new_entries;
        size_t new_capacity = sb->vecs.capacity == 0 ? 4 : sb->vecs.capacity * 2;
        if ((new_entries = realloc(sb->vecs.entries, new_capacity * sizeof(*sb->vecs.entries))) == NULL)
            return PTLS_ERROR_NO_MEMORY;
        sb->vecs.entries = new_entries;
        sb->vecs.capacity = new_capacity;
    }
    sb->vecs.entries[sb->vecs.size++] = *vec;
    sb->bytes_written += vec->len;

    return quicly_stream_sync_sendbuf(stream, 1);
}